

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

void cdeque_free(cdeque *d)

{
  cdeque *d_local;
  
  if ((d != (cdeque *)0x0) && (d->arr != (size_t *)0x0)) {
    free(d->arr);
    d->arr = (size_t *)0x0;
    d->beg_pos = 0xffff;
    d->end_pos = 0xffff;
    d->cap_mask = 0;
  }
  return;
}

Assistant:

static void cdeque_free(struct cdeque* d) {
	if(!d)
		return;

	if(!d->arr)
		return;

	free(d->arr);

	d->arr = NULL;
	d->beg_pos = -1;
	d->end_pos = -1;
	d->cap_mask = 0;
}